

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O3

Vec3<double> * __thiscall Imath_2_5::Vec3<double>::normalize(Vec3<double> *this)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined1 auVar3 [16];
  
  dVar2 = this->z * this->z + this->x * this->x + this->y * this->y;
  if (4.450147717014403e-308 <= dVar2) {
    dVar2 = SQRT(dVar2);
  }
  else {
    dVar2 = lengthTiny(this);
  }
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    auVar3._0_8_ = this->x;
    auVar3._8_8_ = this->y;
    auVar1._8_8_ = dVar2;
    auVar1._0_8_ = dVar2;
    auVar3 = divpd(auVar3,auVar1);
    this->x = (double)auVar3._0_8_;
    this->y = (double)auVar3._8_8_;
    this->z = this->z / dVar2;
  }
  return this;
}

Assistant:

const Vec3<T> &
Vec3<T>::normalize ()
{
    T l = length();

    if (l != T (0))
    {
        //
        // Do not replace the divisions by l with multiplications by 1/l.
        // Computing 1/l can overflow but the divisions below will always
        // produce results less than or equal to 1.
        //

	x /= l;
	y /= l;
	z /= l;
    }

    return *this;
}